

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.cc
# Opt level: O0

void * valloc(size_t __size)

{
  void *pvVar1;
  size_t in_stack_00000028;
  size_t in_stack_00000030;
  
  pvVar1 = snmalloc::libc::memalign(in_stack_00000030,in_stack_00000028);
  return pvVar1;
}

Assistant:

SNMALLOC_EXPORT void* SNMALLOC_NAME_MANGLE(valloc)(size_t size)
  {
    return snmalloc::libc::memalign(OS_PAGE_SIZE, size);
  }